

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void Save_Trainer(char *filename,bool save_with_examples)

{
  byte bVar1;
  Am_String *pAVar2;
  Am_Value_List *pAVar3;
  Am_String local_260;
  Am_String local_258;
  Am_Value_List local_250 [16];
  Am_Value_List local_240 [16];
  Am_Gesture_Classifier local_230 [8];
  Am_Gesture_Classifier cl;
  long local_218;
  ofstream out;
  bool save_with_examples_local;
  char *filename_local;
  
  std::ofstream::ofstream(&local_218,filename,0x10);
  if (save_with_examples) {
    operator<<((ostream *)&local_218,(Am_Gesture_Trainer *)&trainer);
  }
  else {
    Am_Gesture_Trainer::Train();
    operator<<((ostream *)&local_218,local_230);
    Am_Gesture_Classifier::~Am_Gesture_Classifier(local_230);
  }
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) != 0) {
    Am_Value_List::Am_Value_List(local_250);
    Am_String::Am_String(&local_258,filename,true);
    pAVar2 = (Am_String *)
             Am_Value_List::Add((Am_String *)local_250,(Am_Add_Position)&local_258,true);
    Am_String::Am_String(&local_260,"can\'t be written.",true);
    pAVar3 = (Am_Value_List *)Am_Value_List::Add(pAVar2,(Am_Add_Position)&local_260,true);
    Am_Value_List::Am_Value_List(local_240,pAVar3);
    Popup_Error(local_240);
    Am_Value_List::~Am_Value_List(local_240);
    Am_String::~Am_String(&local_260);
    Am_String::~Am_String(&local_258);
    Am_Value_List::~Am_Value_List(local_250);
  }
  std::ofstream::~ofstream(&local_218);
  return;
}

Assistant:

void
Save_Trainer(char *filename, bool save_with_examples)
{
  ofstream out(filename);

  if (save_with_examples)
    out << trainer;
  else {
    Am_Gesture_Classifier cl = trainer.Train();
    out << cl;
  }

  if (!out)
    Popup_Error(Am_Value_List()
                    .Add(Am_String(filename))
                    .Add(Am_String("can't be written.")));
}